

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall json::Value::unescapeIntoWTF16(Value *this,char *str)

{
  stringstream local_1d0 [8];
  stringstream ss;
  ostream local_1c0 [376];
  IString local_48;
  string local_38;
  
  std::__cxx11::stringstream::stringstream(local_1d0);
  ::wasm::String::unescapeUTF8JSONtoWTF16(local_1c0,str);
  std::__cxx11::stringbuf::str();
  ::wasm::IString::IString(&local_48,&local_38);
  setString(this,&local_48);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::stringstream::~stringstream(local_1d0);
  return;
}

Assistant:

void unescapeIntoWTF16(char* str) {
    // TODO: Optimize the unescaped path? But it is impossible to avoid an
    //       allocation here.
    std::stringstream ss;
    wasm::String::unescapeUTF8JSONtoWTF16(ss, str);
    // TODO: Use ss.view() once we have C++20.
    setString(ss.str());
  }